

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  iterator iVar2;
  bool bVar3;
  char *pcVar4;
  FILE *__stream;
  ulong uVar5;
  int i;
  int index;
  SetKey<const_char_*,_Identity> *pSVar6;
  internal iVar7;
  float fVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  TypeParam ht_in;
  TypeParam ht_out;
  Hasher local_200;
  AssertHelper local_1f0;
  undefined1 local_1e8 [8];
  undefined8 *local_1e0;
  SetKey<const_char_*,_Identity> local_1d1;
  iterator local_1d0;
  undefined1 *local_188;
  undefined1 local_180 [16];
  undefined1 local_170 [28];
  float local_154;
  undefined1 local_150;
  type local_130;
  sparsetable<char_const*,(unsigned_short)48,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  local_128 [56];
  int *local_f0;
  undefined **local_d8;
  undefined1 local_d0 [160];
  
  local_1d0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_1d0.pos.row_begin._M_current = local_1d0.pos.row_begin._M_current & 0xffffffff00000000;
  local_1e8 = (undefined1  [8])0x0;
  local_1e0 = (undefined8 *)((ulong)local_1e0 & 0xffffffff00000000);
  local_180._0_8_ = local_180._0_8_ & 0xffffffff00000000;
  local_180._8_8_ =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_d8 = &PTR__BaseHashtableInterface_00c19198;
  pSVar6 = (SetKey<const_char_*,_Identity> *)&local_1f0;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)local_d0,0,(Hasher *)&local_1d0,(Hasher *)local_1e8,(Identity *)&local_200,
                     pSVar6,(Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)local_180)
  ;
  local_d8 = &PTR__BaseHashtableInterface_00c19118;
  pcVar4 = UniqueObjectHelper<char_const*>(2000);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)local_d0);
  local_d0[0x2a] = true;
  index = 1;
  local_d0._64_8_ = pcVar4;
  do {
    local_1d0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)UniqueObjectHelper<char_const*>(index);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)local_d0,1);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_180,
                      (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                       *)local_d0,(const_reference)&local_1d0);
    index = index + 1;
  } while (index != 100);
  local_180._0_8_ = UniqueObjectHelper<char_const*>(0x38);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
           *)local_d0,(key_type *)local_180);
  local_180._0_8_ = UniqueObjectHelper<char_const*>(0x16);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
           *)local_d0,(key_type *)local_180);
  __stream = tmpfile();
  iVar7 = (internal)(__stream != (FILE *)0x0);
  local_1d0.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1d0.ht._0_1_ = iVar7;
  if (!(bool)iVar7) {
    testing::Message::Message((Message *)local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_180,(internal *)&local_1d0,(AssertionResult *)"fp != __null","false",
               "true",(char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b8,(char *)local_180._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_180._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_170) {
      operator_delete((void *)local_180._0_8_);
    }
    if (local_1e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1e8 + 8))();
    }
    iVar2._M_current = local_1d0.pos.row_begin._M_current;
    if (local_1d0.pos.row_begin._M_current !=
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((int **)(local_1d0.pos.row_begin._M_current)->group !=
          &((local_1d0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_1d0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)local_d0);
  bVar3 = google::
          sparsetable<char_const*,(unsigned_short)48,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
          ::serialize<ValueSerializer,_IO_FILE>
                    ((sparsetable<char_const*,(unsigned_short)48,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                      *)(local_d0 + 0x50));
  local_1d0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1d0.ht._1_7_,bVar3);
  local_1d0.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_180,(internal *)&local_1d0,
               (AssertionResult *)"ht_out.serialize(ValueSerializer(), fp)","false","true",
               (char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b9,(char *)local_180._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_180._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_170) {
      operator_delete((void *)local_180._0_8_);
    }
    if (local_1e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1e8 + 8))();
    }
    iVar2._M_current = local_1d0.pos.row_begin._M_current;
    if (local_1d0.pos.row_begin._M_current !=
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((int **)(local_1d0.pos.row_begin._M_current)->group !=
          &((local_1d0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_1d0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  rewind(__stream);
  local_1e8 = (undefined1  [8])0x0;
  local_1e0 = (undefined8 *)((ulong)local_1e0 & 0xffffffff00000000);
  local_200._0_8_ = (AssertHelperData *)0x0;
  local_200.num_compares_ = 0;
  local_1d0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_1d0.ht & 0xffffffff00000000);
  local_1d0.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  this_00 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)(local_180 + 8);
  local_180._0_8_ = &PTR__BaseHashtableInterface_00c19198;
  pSVar6 = &local_1d1;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(Hasher *)local_1e8,&local_200,(Identity *)&local_1f0,pSVar6,
                     (Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)&local_1d0);
  local_180._0_8_ = &PTR__BaseHashtableInterface_00c19118;
  local_1e0 = (undefined8 *)0x0;
  local_1e8[0] = iVar7;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1e8,(AssertionResult *)"fp != __null","false",
               "true",(char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4bd,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if (local_1d0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_200._0_8_ + 8))();
    }
    puVar1 = local_1e0;
    if (local_1e0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1e0 != local_1e0 + 2) {
        operator_delete((undefined8 *)*local_1e0);
      }
      operator_delete(puVar1);
    }
  }
  local_130 = (type)0x0;
  local_1e8[0] = (internal)
                 google::
                 sparsetable<char_const*,(unsigned_short)48,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                 ::unserialize<ValueSerializer,_IO_FILE>(local_128,__stream);
  fVar8 = (float)local_170._24_4_ * (float)local_f0;
  uVar5 = (ulong)fVar8;
  local_170._8_8_ = (long)(fVar8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  local_154 = (float)local_f0 * local_154;
  uVar5 = (ulong)local_154;
  local_170._16_8_ = (long)(local_154 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  local_150 = 0;
  local_1e0 = (undefined8 *)0x0;
  if (!(bool)local_1e8[0]) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1e8,
               (AssertionResult *)"ht_in.unserialize(ValueSerializer(), fp)","false","true",
               (char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4be,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if (local_1d0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_200._0_8_ + 8))();
    }
    puVar1 = local_1e0;
    if (local_1e0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1e0 != local_1e0 + 2) {
        operator_delete((undefined8 *)*local_1e0);
      }
      operator_delete(puVar1);
    }
  }
  fclose(__stream);
  local_200._0_8_ = UniqueObjectHelper<char_const*>(1);
  local_1f0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>(&local_1d0,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_1f0);
  local_188 = local_180;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_1e8,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (char **)&local_200,local_1d0.pos.col_current);
  if (local_1e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1e0 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if (local_1d0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1d0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> + 8
                  ))();
    }
  }
  puVar1 = local_1e0;
  if (local_1e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e0 != local_1e0 + 2) {
      operator_delete((undefined8 *)*local_1e0);
    }
    operator_delete(puVar1);
  }
  local_200._0_8_ = UniqueObjectHelper<char_const*>(99);
  local_1f0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(99);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>(&local_1d0,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_1f0);
  local_188 = local_180;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_1e8,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (char **)&local_200,local_1d0.pos.col_current);
  if (local_1e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1e0 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if (local_1d0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1d0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> + 8
                  ))();
    }
  }
  puVar1 = local_1e0;
  if (local_1e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e0 != local_1e0 + 2) {
      operator_delete((undefined8 *)*local_1e0);
    }
    operator_delete(puVar1);
  }
  local_1d0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(100);
  pVar9 = google::
          sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
          ::find_position<char_const*>
                    ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                      *)this_00,(char **)&local_1d0);
  bVar3 = pVar9.first == 0xffffffffffffffff;
  local_1e8[0] = (internal)bVar3;
  local_1e0 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1e8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",(char *)pSVar6)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c3,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if (local_1d0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_200._0_8_ + 8))();
    }
    puVar1 = local_1e0;
    if (local_1e0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1e0 != local_1e0 + 2) {
        operator_delete((undefined8 *)*local_1e0);
      }
      operator_delete(puVar1);
    }
  }
  local_200._0_8_ = UniqueObjectHelper<char_const*>(0x15);
  local_1f0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x15);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>(&local_1d0,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_1f0);
  local_188 = local_180;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_1e8,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (char **)&local_200,local_1d0.pos.col_current);
  if (local_1e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1e0 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if (local_1d0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1d0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> + 8
                  ))();
    }
  }
  puVar1 = local_1e0;
  if (local_1e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e0 != local_1e0 + 2) {
      operator_delete((undefined8 *)*local_1e0);
    }
    operator_delete(puVar1);
  }
  local_1d0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(0x16);
  pVar9 = google::
          sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
          ::find_position<char_const*>
                    ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                      *)this_00,(char **)&local_1d0);
  iVar7 = (internal)(pVar9.first == 0xffffffffffffffff);
  local_1e0 = (undefined8 *)0x0;
  local_1e8[0] = iVar7;
  if (!(bool)iVar7) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1e8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",(char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c6,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if (local_1d0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_200._0_8_ + 8))();
    }
    puVar1 = local_1e0;
    if (local_1e0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1e0 != local_1e0 + 2) {
        operator_delete((undefined8 *)*local_1e0);
      }
      operator_delete(puVar1);
    }
  }
  local_1d0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(0x38);
  pVar9 = google::
          sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
          ::find_position<char_const*>
                    ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                      *)this_00,(char **)&local_1d0);
  local_1e8[0] = (internal)(pVar9.first == 0xffffffffffffffff);
  local_1e0 = (undefined8 *)0x0;
  if (!(bool)local_1e8[0]) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1e8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",(char *)pSVar6);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c7,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if (local_1d0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_200._0_8_ + 8))();
    }
    puVar1 = local_1e0;
    if (local_1e0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1e0 != local_1e0 + 2) {
        operator_delete((undefined8 *)*local_1e0);
      }
      operator_delete(puVar1);
    }
  }
  local_180._0_8_ = &PTR__BaseHashtableInterface_00c19198;
  std::
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_128);
  local_d8 = &PTR__BaseHashtableInterface_00c19198;
  std::
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_d0 + 0x50));
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}